

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.hpp
# Opt level: O0

void __thiscall
nonstd::optional_lite::optional<tinyusdz::Animatable<double>>::
initialize<tinyusdz::Animatable<double>>
          (optional<tinyusdz::Animatable<double>> *this,Animatable<double> *value)

{
  bool bVar1;
  Animatable<double> *value_local;
  optional<tinyusdz::Animatable<double>_> *this_local;
  
  bVar1 = optional<tinyusdz::Animatable<double>_>::has_value
                    ((optional<tinyusdz::Animatable<double>_> *)this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("! has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                  ,0x5dd,
                  "void nonstd::optional_lite::optional<tinyusdz::Animatable<double>>::initialize(V &&) [T = tinyusdz::Animatable<double>, V = tinyusdz::Animatable<double>]"
                 );
  }
  detail::storage_t<tinyusdz::Animatable<double>_>::construct_value
            ((storage_t<tinyusdz::Animatable<double>_> *)(this + 8),value);
  *this = (optional<tinyusdz::Animatable<double>>)0x1;
  return;
}

Assistant:

void initialize( V && value )
    {
        assert( ! has_value()  );
        contained.construct_value( std::move( value ) );
        has_value_ = true;
    }